

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

bool __thiscall PruneReplayer::filter_shader_module(PruneReplayer *this,Hash hash)

{
  bool bVar1;
  size_type sVar2;
  Hash local_20;
  Hash hash_local;
  PruneReplayer *this_local;
  
  local_20 = hash;
  hash_local = (Hash)this;
  sVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::count(&this->banned_modules,&local_20);
  if (sVar2 == 0) {
    bVar1 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::empty(&this->filter_modules);
    if (bVar1) {
      this_local._7_1_ = true;
    }
    else {
      sVar2 = std::
              unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
              ::count(&this->filter_modules,&local_20);
      this_local._7_1_ = sVar2 != 0;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool filter_shader_module(Hash hash) const
	{
		if (banned_modules.count(hash))
			return false;
		if (filter_modules.empty())
			return true;

		return filter_modules.count(hash) != 0;
	}